

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.h
# Opt level: O2

void __thiscall
di::Context::addFactoryPriv<A,B>(Context *this,FactoryFunction<A,_B> factoryFunction)

{
  mapped_type *pmVar1;
  runtime_error *this_00;
  allocator local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  type_index instanceTypeIdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  instanceTypeIdx._M_target = (type_info *)&A::typeinfo;
  pmVar1 = std::
           map<std::type_index,_di::Context::CtxItem,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_di::Context::CtxItem>_>_>
           ::operator[](&this->items,&instanceTypeIdx);
  if ((pmVar1->factory).super__Function_base._M_manager == (_Manager_type)0x0) {
    local_60._M_dataplus._M_p = (pointer)factoryFunction;
    local_60._M_string_length = (size_type)this;
    std::function<void()>::operator=
              ((function<void()> *)&pmVar1->factory,(anon_class_16_2_9ea09bd3 *)&local_60);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_38,"Factory already registed for type: ",&local_61);
  std::operator+(&local_60,&local_38,"1A");
  std::runtime_error::runtime_error(this_00,(string *)&local_60);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void addFactoryPriv(FactoryFunction<InstanceType, Args...> factoryFunction)
    {
        auto instanceTypeIdx = std::type_index(typeid(InstanceType));

#ifdef HAS_TR2
        declareBaseTypes< typename std::tr2::bases<InstanceType>::type >( instanceTypeIdx );
#else
        declareBaseTypes<InstanceType>( instanceTypeIdx );
#endif

        CtxItem& item = items[ instanceTypeIdx ];

        if (item.factory)
            throw std::runtime_error(std::string("Factory already registed for type: ") + typeid(InstanceType).name());

        item.factory = [factoryFunction, this]()
        {
            addInstance(factoryFunction( get<Args>()... ), true);
        };
    }